

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86internal.cpp
# Opt level: O1

Error asmjit::X86Internal::argsToFrameInfo(FuncArgsMapper *args,FuncFrameInfo *ffi)

{
  Error EVar1;
  long lVar2;
  uint32_t *puVar3;
  X86FuncArgsContext ctx;
  X86FuncArgsContext local_11c;
  
  memset(&local_11c,0,0x102);
  EVar1 = X86FuncArgsContext::initWorkData
                    (&local_11c,args,ffi->_dirtyRegs,(bool)((byte)ffi->_attributes & 1));
  if (EVar1 == 0) {
    lVar2 = 1;
    puVar3 = &local_11c._workData[0].workRegs;
    do {
      *puVar3 = *puVar3 | puVar3[3] | puVar3[1];
      ffi->_dirtyRegs[lVar2 + -1] = ffi->_dirtyRegs[lVar2 + -1] | puVar3[3] | puVar3[1];
      lVar2 = lVar2 + 1;
      puVar3 = puVar3 + 0x10;
    } while (lVar2 != 5);
    X86FuncArgsContext::markRegsForSwaps(&local_11c,ffi);
    EVar1 = X86FuncArgsContext::markStackArgsReg(&local_11c,ffi);
  }
  return EVar1;
}

Assistant:

ASMJIT_FAVOR_SIZE Error X86Internal::argsToFrameInfo(const FuncArgsMapper& args, FuncFrameInfo& ffi) noexcept {
  X86FuncArgsContext ctx;
  ASMJIT_PROPAGATE(ctx.initWorkData(args, ffi._dirtyRegs, ffi.hasPreservedFP()));

  ASMJIT_PROPAGATE(ctx.markDstRegsDirty(ffi));
  ASMJIT_PROPAGATE(ctx.markRegsForSwaps(ffi));
  ASMJIT_PROPAGATE(ctx.markStackArgsReg(ffi));
  return kErrorOk;
}